

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O3

void P_FakeZMovement(AActor *mo)

{
  uint uVar1;
  AActor *pAVar2;
  player_t *ppVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  
  dVar4 = (mo->Vel).Z + (mo->__Pos).Z;
  (mo->__Pos).Z = dVar4;
  uVar1 = (mo->flags).Value;
  if (((uVar1 >> 0xe & 1) != 0) && (pAVar2 = (mo->target).field_0.p, pAVar2 != (AActor *)0x0)) {
    if (((pAVar2->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
      if ((uVar1 & 0x1200000) == 0) {
        dVar5 = AActor::Distance2D(mo,pAVar2,false);
        pAVar2 = (mo->target).field_0.p;
        dVar4 = (mo->__Pos).Z;
        dVar6 = (pAVar2->Height * 0.5 + (pAVar2->__Pos).Z) - dVar4;
        if ((0.0 <= dVar6) || (dVar6 * -3.0 <= dVar5)) {
          if ((dVar6 <= 0.0) || (dVar6 * 3.0 <= dVar5)) goto LAB_0040d522;
          dVar4 = dVar4 + mo->FloatSpeed;
        }
        else {
          dVar4 = dVar4 - mo->FloatSpeed;
        }
        (mo->__Pos).Z = dVar4;
      }
    }
    else {
      (mo->target).field_0.p = (AActor *)0x0;
    }
  }
LAB_0040d522:
  ppVar3 = mo->player;
  if ((((ppVar3 != (player_t *)0x0) && (((mo->flags).Value & 0x200) != 0)) &&
      (mo->floorz <= dVar4 && dVar4 != mo->floorz)) &&
     ((ppVar3->mo != (APlayerPawn *)mo || ((ppVar3->cheats & 0x40000000) == 0)))) {
    dVar4 = FFastTrig::sin(&fasttrig,
                           (double)level.maptime * 4.5 * 11930464.711111112 + 6755399441055744.0);
    dVar4 = dVar4 + (mo->__Pos).Z;
    (mo->__Pos).Z = dVar4;
  }
  dVar5 = mo->floorz;
  if (dVar4 <= dVar5) {
    (mo->__Pos).Z = dVar5;
    dVar4 = dVar5;
  }
  if (mo->ceilingz < dVar4 + mo->Height) {
    (mo->__Pos).Z = mo->ceilingz - mo->Height;
  }
  return;
}

Assistant:

void P_FakeZMovement(AActor *mo)
{
	//
	// adjust height
	//
	mo->AddZ(mo->Vel.Z);
	if ((mo->flags&MF_FLOAT) && mo->target)
	{ // float down towards target if too close
		if (!(mo->flags & MF_SKULLFLY) && !(mo->flags & MF_INFLOAT))
		{
			double dist = mo->Distance2D(mo->target);
			double delta = mo->target->Center() - mo->Z();
			if (delta < 0 && dist < -(delta * 3))
				mo->AddZ(-mo->FloatSpeed);
			else if (delta > 0 && dist < (delta * 3))
				mo->AddZ(mo->FloatSpeed);
		}
	}
	if (mo->player && mo->flags&MF_NOGRAVITY && (mo->Z() > mo->floorz) && !mo->IsNoClip2())
	{
		mo->AddZ(DAngle(4.5 * level.maptime).Sin());
	}

	//
	// clip movement
	//
	if (mo->Z() <= mo->floorz)
	{ // hit the floor
		mo->SetZ(mo->floorz);
	}

	if (mo->Top() > mo->ceilingz)
	{ // hit the ceiling
		mo->SetZ(mo->ceilingz - mo->Height);
	}
}